

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IntegrityCheckPgidx(Fts5Index *p,Fts5Data *pLeaf)

{
  int iVar1;
  bool bVar2;
  u32 local_58;
  u32 local_54;
  int nByte_1;
  int nKeep;
  int nByte;
  int nIncr;
  int iOff;
  int res;
  Fts5Buffer buf2;
  Fts5Buffer buf1;
  int ii;
  int iTermOff;
  Fts5Data *pLeaf_local;
  Fts5Index *p_local;
  
  buf1.nSpace = 0;
  memset(&buf2.n,0,0x10);
  memset(&iOff,0,0x10);
  buf1.n = pLeaf->szLeaf;
  while( true ) {
    bVar2 = false;
    if (buf1.n < pLeaf->nn) {
      bVar2 = p->rc == 0;
    }
    if (!bVar2) break;
    iVar1 = sqlite3Fts5GetVarint32(pLeaf->p + buf1.n,(u32 *)&nKeep);
    buf1.n = iVar1 + buf1.n;
    buf1.nSpace = nKeep + buf1.nSpace;
    nByte = buf1.nSpace;
    if (buf1.nSpace < pLeaf->szLeaf) {
      if (buf1.nSpace == nKeep) {
        iVar1 = sqlite3Fts5GetVarint32(pLeaf->p + buf1.nSpace,(u32 *)&nByte_1);
        nByte = iVar1 + nByte;
        if (pLeaf->szLeaf < nByte + nByte_1) {
          p->rc = 0x10b;
        }
        else {
          sqlite3Fts5BufferSet(&p->rc,(Fts5Buffer *)&buf2.n,nByte_1,pLeaf->p + nByte);
        }
      }
      else {
        iVar1 = sqlite3Fts5GetVarint32(pLeaf->p + buf1.nSpace,&local_54);
        nByte = iVar1 + nByte;
        iVar1 = sqlite3Fts5GetVarint32(pLeaf->p + nByte,&local_58);
        nByte = iVar1 + nByte;
        if (((int)(u32)buf1.p < (int)local_54) || (pLeaf->szLeaf < (int)(nByte + local_58))) {
          p->rc = 0x10b;
        }
        else {
          buf1.p._0_4_ = local_54;
          sqlite3Fts5BufferAppendBlob(&p->rc,(Fts5Buffer *)&buf2.n,local_58,pLeaf->p + nByte);
        }
        if ((p->rc == 0) &&
           (nIncr = fts5BufferCompare((Fts5Buffer *)&buf2.n,(Fts5Buffer *)&iOff), nIncr < 1)) {
          p->rc = 0x10b;
        }
      }
    }
    else {
      p->rc = 0x10b;
    }
    sqlite3Fts5BufferSet(&p->rc,(Fts5Buffer *)&iOff,(u32)buf1.p,(u8 *)buf2._8_8_);
  }
  sqlite3Fts5BufferFree((Fts5Buffer *)&buf2.n);
  sqlite3Fts5BufferFree((Fts5Buffer *)&iOff);
  return;
}

Assistant:

static void fts5IntegrityCheckPgidx(Fts5Index *p, Fts5Data *pLeaf){
  int iTermOff = 0;
  int ii;

  Fts5Buffer buf1 = {0,0,0};
  Fts5Buffer buf2 = {0,0,0};

  ii = pLeaf->szLeaf;
  while( ii<pLeaf->nn && p->rc==SQLITE_OK ){
    int res;
    int iOff;
    int nIncr;

    ii += fts5GetVarint32(&pLeaf->p[ii], nIncr);
    iTermOff += nIncr;
    iOff = iTermOff;

    if( iOff>=pLeaf->szLeaf ){
      p->rc = FTS5_CORRUPT;
    }else if( iTermOff==nIncr ){
      int nByte;
      iOff += fts5GetVarint32(&pLeaf->p[iOff], nByte);
      if( (iOff+nByte)>pLeaf->szLeaf ){
        p->rc = FTS5_CORRUPT;
      }else{
        fts5BufferSet(&p->rc, &buf1, nByte, &pLeaf->p[iOff]);
      }
    }else{
      int nKeep, nByte;
      iOff += fts5GetVarint32(&pLeaf->p[iOff], nKeep);
      iOff += fts5GetVarint32(&pLeaf->p[iOff], nByte);
      if( nKeep>buf1.n || (iOff+nByte)>pLeaf->szLeaf ){
        p->rc = FTS5_CORRUPT;
      }else{
        buf1.n = nKeep;
        fts5BufferAppendBlob(&p->rc, &buf1, nByte, &pLeaf->p[iOff]);
      }

      if( p->rc==SQLITE_OK ){
        res = fts5BufferCompare(&buf1, &buf2);
        if( res<=0 ) p->rc = FTS5_CORRUPT;
      }
    }
    fts5BufferSet(&p->rc, &buf2, buf1.n, buf1.p);
  }

  fts5BufferFree(&buf1);
  fts5BufferFree(&buf2);
}